

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

void finish(audit_regressor_data *dat)

{
  ostream *poVar1;
  long *in_RDI;
  
  if ((ulong)in_RDI[7] < (ulong)in_RDI[6]) {
    poVar1 = std::operator<<((ostream *)(*in_RDI + 0xe0),
                             "Note: for some reason audit couldn\'t find all regressor values in dataset ("
                            );
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[7]);
    poVar1 = std::operator<<(poVar1," of ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI[6]);
    poVar1 = std::operator<<(poVar1," found).");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void finish(audit_regressor_data& dat)
{
  if (dat.values_audited < dat.loaded_regressor_values)
    dat.all->trace_message << "Note: for some reason audit couldn't find all regressor values in dataset ("
                           << dat.values_audited << " of " << dat.loaded_regressor_values << " found)." << endl;
}